

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O2

void __thiscall cs::instance_type::parse_using(instance_type *this,iterator it,bool override)

{
  token_base *ptVar1;
  _func_int **pp_Var2;
  element_type *peVar3;
  bool bVar4;
  int iVar5;
  token_base **pptVar6;
  undefined4 extraout_var;
  shared_ptr<cs::name_space> *psVar7;
  runtime_error *this_00;
  type_info *this_01;
  _func_int **pp_Var8;
  tree_type<cs::token_base_*> *t;
  _func_int **pp_Var9;
  size_t sVar10;
  allocator local_61;
  var ns;
  iterator it_local;
  string local_50;
  
  it_local = it;
  pptVar6 = tree_type<cs::token_base_*>::iterator::data(&it_local);
  iVar5 = (*(*pptVar6)->_vptr_token_base[2])();
  if (iVar5 == 0xf) {
    pptVar6 = tree_type<cs::token_base_*>::iterator::data(&it_local);
    ptVar1 = *pptVar6;
    pp_Var9 = ptVar1[2]._vptr_token_base;
    pp_Var8 = ptVar1[3]._vptr_token_base;
    sVar10 = ptVar1[3].line_num;
    pp_Var2 = ptVar1[4]._vptr_token_base;
    while (pp_Var9 != pp_Var2) {
      parse_using(this,(tree_node *)*pp_Var9,false);
      pp_Var9 = pp_Var9 + 1;
      if (pp_Var9 == pp_Var8) {
        pp_Var9 = *(_func_int ***)(sVar10 + 8);
        sVar10 = sVar10 + 8;
        pp_Var8 = pp_Var9 + 0x40;
      }
    }
  }
  else {
    runtime_type::parse_expr
              ((runtime_type *)&ns,
               (iterator *)
               (((this->context).super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->instance).super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr,SUB81(&it_local,0));
    if (ns.mDat == (proxy *)0x0) {
      this_01 = (type_info *)&void::typeinfo;
    }
    else {
      iVar5 = (*(ns.mDat)->data->_vptr_baseHolder[2])();
      this_01 = (type_info *)CONCAT44(extraout_var,iVar5);
    }
    bVar4 = std::type_info::operator==
                      (this_01,(type_info *)&std::shared_ptr<cs::name_space>::typeinfo);
    if (!bVar4) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string((string *)&local_50,"Only support involve namespace.",&local_61);
      runtime_error::runtime_error(this_00,&local_50);
      __cxa_throw(this_00,&runtime_error::typeinfo,runtime_error::~runtime_error);
    }
    peVar3 = (((this->context).super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->instance).super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    psVar7 = cs_impl::any::const_val<std::shared_ptr<cs::name_space>>(&ns);
    domain_manager::involve_domain
              (&(peVar3->super_runtime_type).storage,
               ((psVar7->super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
               m_data,override);
    cs_impl::any::recycle(&ns);
  }
  return;
}

Assistant:

void instance_type::parse_using(tree_type<token_base *>::iterator it, bool override)
	{
		if (it.data()->get_type() == token_types::parallel) {
			auto &parallel_list = static_cast<token_parallel *>(it.data())->get_parallel();
			for (auto &t: parallel_list)
				parse_using(t.root());
		}
		else {
			var ns = context->instance->parse_expr(it, true);
			if (ns.type() == typeid(namespace_t))
				context->instance->storage.involve_domain(ns.const_val<namespace_t>()->get_domain(), override);
			else
				throw runtime_error("Only support involve namespace.");
		}
	}